

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void var_new(LexState *ls,BCReg n,GCstr *name)

{
  uint uVar1;
  uint uVar2;
  FuncState *fs;
  VarInfo *pVVar3;
  uint uVar4;
  MSize MVar5;
  
  fs = ls->fs;
  uVar4 = fs->nactvar + n;
  if (199 < uVar4) {
    err_limit(fs,200,"local variables");
  }
  uVar1 = ls->vtop;
  uVar2 = ls->sizevstack;
  if (uVar1 < uVar2) {
    pVVar3 = ls->vstack;
  }
  else {
    if (0xffc3 < uVar2) {
      lj_lex_error(ls,0,LJ_ERR_XLIMC,0xffc4);
    }
    MVar5 = 8;
    if (8 < uVar2 * 2) {
      MVar5 = uVar2 * 2;
    }
    if (0xffc3 < MVar5) {
      MVar5 = 0xffc4;
    }
    pVVar3 = (VarInfo *)lj_mem_realloc(ls->L,ls->vstack,uVar2 << 4,MVar5 << 4);
    ls->sizevstack = MVar5;
    ls->vstack = pVVar3;
    uVar4 = n + fs->nactvar;
  }
  pVVar3[uVar1].name.gcptr32 = (uint32_t)name;
  fs->varmap[uVar4] = (VarIndex)uVar1;
  ls->vtop = uVar1 + 1;
  return;
}

Assistant:

static void var_new(LexState *ls, BCReg n, GCstr *name)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  checklimit(fs, fs->nactvar+n, LJ_MAX_LOCVAR, "local variables");
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lua_assert((uintptr_t)name < VARNAME__MAX ||
	     lj_tab_getstr(fs->kt, name) != NULL);
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  fs->varmap[fs->nactvar+n] = (uint16_t)vtop;
  ls->vtop = vtop+1;
}